

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O0

void __thiscall
Reset_resetRemoveResetValue_Test::Reset_resetRemoveResetValue_Test
          (Reset_resetRemoveResetValue_Test *this)

{
  Reset_resetRemoveResetValue_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Reset_resetRemoveResetValue_Test_00127498;
  return;
}

Assistant:

TEST(Reset, resetRemoveResetValue)
{
    libcellml::ResetPtr r = libcellml::Reset::create();

    EXPECT_EQ("", r->resetValue());

    r->setResetValue("some reset sort of math");

    EXPECT_EQ("some reset sort of math", r->resetValue());

    r->removeResetValue();

    EXPECT_EQ("", r->resetValue());
}